

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Underwater_Acoustic_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pSVar3;
  pointer pAVar4;
  pointer pUVar5;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  string local_340 [32];
  __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
  local_320;
  const_iterator citrUAESEnd;
  const_iterator citrUAES;
  __normal_iterator<const_KDIS::DATA_TYPE::APA_*,_std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>_>
  local_2f0;
  const_iterator citrAPAEnd;
  const_iterator citrAPA;
  __normal_iterator<const_KDIS::DATA_TYPE::Shaft_*,_std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>_>
  local_2c0;
  const_iterator citrShaftsEnd;
  const_iterator citrShafts;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Underwater_Acoustic_PDU *local_18;
  Underwater_Acoustic_PDU *this_local;
  
  local_18 = this;
  this_local = (Underwater_Acoustic_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Underwater Acoustic PDU-\n");
  poVar2 = std::operator<<(poVar2,"Emitting Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_210,&this->m_EmittingEntityID);
  UTILS::IndentString(&local_1f0,&local_210,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Event ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_250,&this->m_EventID);
  UTILS::IndentString(&local_230,&local_250,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,"State Update Indicator:  ");
  DATA_TYPE::ENUMS::GetEnumAsStringStateUpdateIndicator_abi_cxx11_
            (&local_270,(ENUMS *)(ulong)this->m_ui8StateUpdateIndicator,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_270);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Passive Parameter Index: ");
  DATA_TYPE::ENUMS::GetEnumAsStringPassiveParameterIndex_abi_cxx11_
            (&local_290,(ENUMS *)(ulong)this->m_ui16PassiveParamIndex,Value_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_290);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Prop Plant Config:       ");
  DATA_TYPE::ENUMS::GetEnumAsStringPropulsionPlantConfiguration_abi_cxx11_
            ((KString *)&citrShafts,(ENUMS *)(ulong)this->m_ui8PropPlantConfig,Value_01);
  poVar2 = std::operator<<(poVar2,(string *)&citrShafts);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Shafts:        ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumShafts);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of APA:           ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumAPA);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of UAES:          ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumEmitterSys);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&citrShafts);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrShaftsEnd =
       std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>::begin
                 (&this->m_vShafts);
  local_2c0._M_current =
       (Shaft *)std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>::end
                          (&this->m_vShafts);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrShaftsEnd,&local_2c0);
    if (!bVar1) break;
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::Shaft_*,_std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>_>
             ::operator->(&citrShaftsEnd);
    (*(pSVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&citrAPA);
    std::operator<<(local_190,(string *)&citrAPA);
    std::__cxx11::string::~string((string *)&citrAPA);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Shaft_*,_std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>_>
    ::operator++(&citrShaftsEnd);
  }
  citrAPAEnd = std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>::begin
                         (&this->m_vAPA);
  local_2f0._M_current =
       (APA *)std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>::end
                        (&this->m_vAPA);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrAPAEnd,&local_2f0);
    if (!bVar1) break;
    pAVar4 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::APA_*,_std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>_>
             ::operator->(&citrAPAEnd);
    (*(pAVar4->super_DataTypeBase)._vptr_DataTypeBase[2])(&citrUAES);
    std::operator<<(local_190,(string *)&citrUAES);
    std::__cxx11::string::~string((string *)&citrUAES);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::APA_*,_std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>_>
    ::operator++(&citrAPAEnd);
  }
  citrUAESEnd = std::
                vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
                ::begin(&this->m_vUAES);
  local_320._M_current =
       (UnderwaterAcousticEmitterSystem *)
       std::
       vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
       ::end(&this->m_vUAES);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrUAESEnd,&local_320);
    if (!bVar1) break;
    pUVar5 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
             ::operator->(&citrUAESEnd);
    (*(pUVar5->super_DataTypeBase)._vptr_DataTypeBase[2])(local_340);
    std::operator<<(local_190,local_340);
    std::__cxx11::string::~string(local_340);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
    ::operator++(&citrUAESEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Underwater_Acoustic_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Underwater Acoustic PDU-\n"
       << "Emitting Entity ID:\n"
       << IndentString( m_EmittingEntityID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 )
       << "State Update Indicator:  " << GetEnumAsStringStateUpdateIndicator( m_ui8StateUpdateIndicator )    << "\n"
       << "Passive Parameter Index: " << GetEnumAsStringPassiveParameterIndex( m_ui16PassiveParamIndex )     << "\n"
       << "Prop Plant Config:       " << GetEnumAsStringPropulsionPlantConfiguration( m_ui8PropPlantConfig ) << "\n"
       << "Number Of Shafts:        " << ( KUINT16 )m_ui8NumShafts               << "\n"
       << "Number Of APA:           " << ( KUINT16 )m_ui8NumAPA                  << "\n"
       << "Number Of UAES:          " << ( KUINT16 )m_ui8NumEmitterSys           << "\n";

    vector<Shaft>::const_iterator citrShafts = m_vShafts.begin();
    vector<Shaft>::const_iterator citrShaftsEnd = m_vShafts.end();
    for( ; citrShafts != citrShaftsEnd; ++citrShafts )
    {
        ss << citrShafts->GetAsString();
    }

    vector<APA>::const_iterator citrAPA =  m_vAPA.begin();
    vector<APA>::const_iterator citrAPAEnd =  m_vAPA.end();
    for( ; citrAPA != citrAPAEnd; ++citrAPA )
    {
        ss << citrAPA->GetAsString();
    }

    vector<UnderwaterAcousticEmitterSystem>::const_iterator citrUAES = m_vUAES.begin();
    vector<UnderwaterAcousticEmitterSystem>::const_iterator citrUAESEnd = m_vUAES.end();
    for( ; citrUAES != citrUAESEnd; ++citrUAES )
    {
        ss << citrUAES->GetAsString();
    }

    return ss.str();
}